

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVReaderOptions::ToString
          (string *__return_storage_ptr__,CSVReaderOptions *this,string *current_file_path)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this_00;
  mapped_type *pmVar1;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  ::std::operator+(&bStack_78,"  file = ",current_file_path);
  ::std::operator+(__return_storage_ptr__,&bStack_78,"\n  ");
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::string((string *)&local_58,"delimiter",(allocator *)&local_38);
  FormatOptionLine<std::__cxx11::string>(&bStack_78,(duckdb *)&local_58,(string *)this,in_RCX);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"quote",(allocator *)&local_38);
  FormatOptionLine<char>(&bStack_78,&local_58,&(this->dialect_options).state_machine_options.quote);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"escape",(allocator *)&local_38);
  FormatOptionLine<char>(&bStack_78,&local_58,&(this->dialect_options).state_machine_options.escape)
  ;
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"new_line",(allocator *)&local_38);
  FormatOptionLine<duckdb::NewLineIdentifier>
            (&bStack_78,&local_58,&(this->dialect_options).state_machine_options.new_line);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"header",(allocator *)&local_38);
  FormatOptionLine<bool>(&bStack_78,&local_58,&(this->dialect_options).header);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"skip_rows",(allocator *)&local_38);
  FormatOptionLine<unsigned_long>(&bStack_78,&local_58,&(this->dialect_options).skip_rows);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"comment",(allocator *)&local_38);
  FormatOptionLine<char>
            (&bStack_78,&local_58,&(this->dialect_options).state_machine_options.comment);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"strict_mode",(allocator *)&local_38);
  FormatOptionLine<bool>
            (&bStack_78,&local_58,&(this->dialect_options).state_machine_options.strict_mode);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"date_format",(allocator *)&local_38);
  this_00 = &(this->dialect_options).date_format;
  pmVar1 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::DATE);
  FormatOptionLine<duckdb::StrpTimeFormat>(&bStack_78,&local_58,pmVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::string((string *)&local_58,"timestamp_format",(allocator *)&local_38);
  pmVar1 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::TIMESTAMP);
  FormatOptionLine<duckdb::StrpTimeFormat>(&bStack_78,&local_58,pmVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::to_string(&local_38,(uint)this->null_padding);
  ::std::operator+(&local_58,"null_padding = ",&local_38);
  ::std::operator+(&bStack_78,&local_58,"\n  ");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::to_string(&local_38,this->sample_size_chunks << 0xb);
  ::std::operator+(&local_58,"sample_size = ",&local_38);
  ::std::operator+(&bStack_78,&local_58,"\n  ");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  CSVOption<bool>::FormatValue_abi_cxx11_(&local_38,&this->ignore_errors);
  ::std::operator+(&local_58,"ignore_errors = ",&local_38);
  ::std::operator+(&bStack_78,&local_58,"\n  ");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::to_string(&local_38,(uint)this->all_varchar);
  ::std::operator+(&local_58,"all_varchar = ",&local_38);
  ::std::operator+(&bStack_78,&local_58,anon_var_dwarf_4b4b0eb + 8);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CSVReaderOptions::ToString(const string &current_file_path) const {
	auto &delimiter = dialect_options.state_machine_options.delimiter;
	auto &quote = dialect_options.state_machine_options.quote;
	auto &escape = dialect_options.state_machine_options.escape;
	auto &comment = dialect_options.state_machine_options.comment;
	auto &new_line = dialect_options.state_machine_options.new_line;
	auto &strict_mode = dialect_options.state_machine_options.strict_mode;
	auto &skip_rows = dialect_options.skip_rows;

	auto &header = dialect_options.header;
	string error = "  file = " + current_file_path + "\n  ";
	// Let's first print options that can either be set by the user or by the sniffer
	// delimiter
	error += FormatOptionLine("delimiter", delimiter);
	// quote
	error += FormatOptionLine("quote", quote);
	// escape
	error += FormatOptionLine("escape", escape);
	// newline
	error += FormatOptionLine("new_line", new_line);
	// has_header
	error += FormatOptionLine("header", header);
	// skip_rows
	error += FormatOptionLine("skip_rows", skip_rows);
	// comment
	error += FormatOptionLine("comment", comment);
	// strict_mode
	error += FormatOptionLine("strict_mode", strict_mode);
	// date format
	error += FormatOptionLine("date_format", dialect_options.date_format.at(LogicalType::DATE));
	// timestamp format
	error += FormatOptionLine("timestamp_format", dialect_options.date_format.at(LogicalType::TIMESTAMP));

	// Now we do options that can only be set by the user, that might hold some general significance
	// null padding
	error += "null_padding = " + std::to_string(null_padding) + "\n  ";
	// sample_size
	error += "sample_size = " + std::to_string(sample_size_chunks * STANDARD_VECTOR_SIZE) + "\n  ";
	// ignore_errors
	error += "ignore_errors = " + ignore_errors.FormatValue() + "\n  ";
	// all_varchar
	error += "all_varchar = " + std::to_string(all_varchar) + "\n";

	// Add information regarding sniffer mismatches (if any)
	error += sniffer_user_mismatch_error;
	return error;
}